

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_pubkey_sort(secp256k1_context *ctx,secp256k1_pubkey **pubkeys,size_t n_pubkeys)

{
  secp256k1_pubkey *psVar1;
  bool bVar2;
  _func_int_void_ptr_void_ptr_void_ptr *in_R8;
  void *in_R9;
  ulong uVar3;
  secp256k1_pubkey_sort_cmp_data cmp_data;
  secp256k1_context *local_30;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_pubkey_sort_cold_2();
  }
  else if (pubkeys != (secp256k1_pubkey **)0x0) {
    if (n_pubkeys < 2) {
      return 1;
    }
    uVar3 = n_pubkeys >> 1;
    local_30 = ctx;
    do {
      uVar3 = uVar3 - 1;
      heap_down((uchar *)pubkeys,uVar3,n_pubkeys,(size_t)&local_30,in_R8,in_R9);
    } while (uVar3 != 0);
    uVar3 = n_pubkeys - 1;
    do {
      psVar1 = *pubkeys;
      *pubkeys = pubkeys[uVar3];
      pubkeys[uVar3] = psVar1;
      heap_down((uchar *)pubkeys,0,uVar3,(size_t)&local_30,in_R8,in_R9);
      bVar2 = 1 < uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    return 1;
  }
  secp256k1_pubkey_sort_cold_1();
  return 0;
}

Assistant:

int secp256k1_pubkey_sort(const secp256k1_context* ctx, const secp256k1_pubkey **pubkeys, size_t n_pubkeys) {
    secp256k1_pubkey_sort_cmp_data cmp_data;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkeys != NULL);

    cmp_data.ctx = ctx;

    /* Suppress wrong warning (fixed in MSVC 19.33) */
    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(push)
    #pragma warning(disable: 4090)
    #endif

    secp256k1_hsort(pubkeys, n_pubkeys, sizeof(*pubkeys), secp256k1_pubkey_sort_cmp, &cmp_data);

    #if defined(_MSC_VER) && (_MSC_VER < 1933)
    #pragma warning(pop)
    #endif

    return 1;
}